

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O3

bool __thiscall xemmai::io::t_writer::f_write_line(t_writer *this,t_io *a_library,t_pvalue *a_value)

{
  t_queue<128UL> *ptVar1;
  bool bVar2;
  pthread_rwlock_t *__rwlock;
  wchar_t *extraout_RDX;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  
  ptVar1 = (this->super_t_sharable).super_t_owned.v_owner;
  if (ptVar1 == *(t_queue<128UL> **)(in_FS_OFFSET + -0x68)) {
    bVar2 = f__write(this,a_library,a_value);
    this->v_step = 4;
    if (bVar2) {
      bVar2 = f__resume(this,a_library);
      return bVar2;
    }
    bVar2 = false;
  }
  else {
    if (ptVar1 != (t_queue<128UL> *)0x0) {
      a_message._M_str = (wchar_t *)a_value;
      a_message._M_len = (size_t)L"owned by another thread.";
      f_throw((xemmai *)0x18,a_message);
    }
    __rwlock = (pthread_rwlock_t *)
               t_lock_with_safe_region<std::shared_mutex>::f_lock(&(this->super_t_sharable).v_mutex)
    ;
    if ((this->super_t_sharable).super_t_owned.v_owner != (t_queue<128UL> *)0x0) {
      a_message_00._M_str = extraout_RDX;
      a_message_00._M_len = (size_t)L"owned by another thread.";
      f_throw((xemmai *)0x18,a_message_00);
    }
    bVar2 = f__write(this,a_library,a_value);
    this->v_step = 4;
    if (bVar2) {
      bVar2 = f__resume(this,a_library);
    }
    else {
      bVar2 = false;
    }
    pthread_rwlock_unlock(__rwlock);
  }
  return bVar2;
}

Assistant:

bool t_writer::f_write_line(t_io* a_library, const t_pvalue& a_value)
{
	return f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		auto b = f__write(a_library, a_value);
		v_step = 4;
		return b && f__resume(a_library);
	});
}